

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

void __thiscall CMU462::Matrix3x3::operator/=(Matrix3x3 *this,double x)

{
  double *pdVar1;
  double in_XMM0_Qa;
  int j;
  int i;
  double rx;
  Matrix3x3 *A;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Matrix3x3 *pMVar2;
  undefined4 local_28;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      pMVar2 = (Matrix3x3 *)(1.0 / in_XMM0_Qa);
      pdVar1 = operator()((Matrix3x3 *)(1.0 / in_XMM0_Qa),in_stack_ffffffffffffffcc,
                          in_stack_ffffffffffffffc8);
      *pdVar1 = (double)pMVar2 * *pdVar1;
    }
  }
  return;
}

Assistant:

void Matrix3x3::operator/=( double x ) {
    Matrix3x3& A( *this );
    double rx = 1./x;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       A( i, j ) *= rx;
    }
  }